

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::CropResizeLayerParams::_InternalParse
          (CropResizeLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  BoxCoordinatesMode *msg;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  float *local_50;
  uint local_44;
  InternalMetadata *local_40;
  RepeatedField<unsigned_long> *local_38;
  
  local_38 = &this->targetsize_;
  local_40 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = (float *)ptr;
LAB_00201a78:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_50);
    if (bVar1) {
      return (char *)local_50;
    }
    local_50 = (float *)google::protobuf::internal::ReadTag((char *)local_50,&local_44,0);
    tag_00 = local_44;
    cVar3 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar3 == '\n') {
        local_50 = (float *)google::protobuf::internal::PackedUInt64Parser
                                      (local_38,(char *)local_50,ctx);
      }
      else {
        if ((local_44 & 0xff) != 8) goto switchD_00201abc_default;
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_50);
        _internal_add_targetsize(this,uVar2);
      }
      break;
    case 2:
      if (cVar3 != '\x10') goto switchD_00201abc_default;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_50);
      this->normalizedcoordinates_ = uVar2 != 0;
      break;
    case 3:
      if (cVar3 != '\x1a') goto switchD_00201abc_default;
      msg = (BoxCoordinatesMode *)_internal_mutable_mode(this);
LAB_00201b1d:
      local_50 = (float *)google::protobuf::internal::ParseContext::ParseMessage
                                    (ctx,&msg->super_MessageLite,(char *)local_50);
      break;
    case 4:
      if (cVar3 == '\"') {
        msg = _internal_mutable_boxindicesmode(this);
        goto LAB_00201b1d;
      }
    default:
switchD_00201abc_default:
      if ((local_44 == 0) || ((local_44 & 7) == 4)) {
        if (local_50 == (float *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
        return (char *)local_50;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_40);
      local_50 = (float *)google::protobuf::internal::UnknownFieldParse
                                    (tag_00,unknown,(char *)local_50,ctx);
      break;
    case 5:
      if (cVar3 != '-') goto switchD_00201abc_default;
      this->spatialscale_ = *local_50;
      local_50 = local_50 + 1;
      goto LAB_00201a78;
    }
    if (local_50 == (float *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CropResizeLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated uint64 targetSize = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_targetsize(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_targetsize(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool normalizedCoordinates = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          normalizedcoordinates_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.SamplingMode mode = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_mode(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_boxindicesmode(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float spatialScale = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 45)) {
          spatialscale_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}